

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O3

int xercesc_4_0::XMLDateTime::compareOrder(XMLDateTime *lValue,XMLDateTime *rValue)

{
  long lVar1;
  int iVar2;
  XMLDateTime lTemp;
  XMLDateTime rTemp;
  XMLDateTime XStack_d8;
  XMLDateTime local_70;
  
  XMLDateTime(&XStack_d8,lValue);
  XMLDateTime(&local_70,rValue);
  normalize(&XStack_d8);
  normalize(&local_70);
  lVar1 = 2;
  iVar2 = -1;
  do {
    if (XStack_d8.fValue[lVar1 + -2] < local_70.fValue[lVar1 + -2]) goto LAB_0024af5f;
    if (local_70.fValue[lVar1 + -2] < XStack_d8.fValue[lVar1 + -2]) {
      iVar2 = 1;
      goto LAB_0024af5f;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 10);
  if (XStack_d8.fHasTime == true) {
    if ((XStack_d8.fMilliSecond < local_70.fMilliSecond) ||
       (iVar2 = 1, local_70.fMilliSecond < XStack_d8.fMilliSecond)) goto LAB_0024af5f;
  }
  iVar2 = 0;
LAB_0024af5f:
  ~XMLDateTime(&local_70);
  ~XMLDateTime(&XStack_d8);
  return iVar2;
}

Assistant:

int XMLDateTime::compareOrder(const XMLDateTime* const lValue
                            , const XMLDateTime* const rValue)
                            //, MemoryManager* const memMgr)
{
    //
    // If any of the them is not normalized() yet,
    // we need to do something here.
    //
    XMLDateTime lTemp = *lValue;
    XMLDateTime rTemp = *rValue;

    lTemp.normalize();
    rTemp.normalize();

    for ( int i = 0 ; i < TOTAL_SIZE; i++ )
    {
        if ( lTemp.fValue[i] < rTemp.fValue[i] )
        {
            return LESS_THAN;
        }
        else if ( lTemp.fValue[i] > rTemp.fValue[i] )
        {
            return GREATER_THAN;
        }
    }

    if ( lTemp.fHasTime)
    {
        if ( lTemp.fMilliSecond < rTemp.fMilliSecond )
        {
            return LESS_THAN;
        }
        else if ( lTemp.fMilliSecond > rTemp.fMilliSecond )
        {
            return GREATER_THAN;
        }
    }

    return EQUAL;
}